

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

void phosg::format_data(function<void_(const_void_*,_unsigned_long)> *write_data,iovec *iovs,
                       size_t num_iovs,uint64_t start_address,iovec *prev_iovs,size_t num_prev_iovs,
                       uint64_t flags)

{
  ulong uVar1;
  double dVar2;
  byte bVar3;
  byte bVar4;
  uint8_t uVar5;
  uint uVar6;
  float fVar7;
  int iVar8;
  byte bVar9;
  size_t *psVar10;
  long lVar11;
  ulong uVar12;
  logic_error *this;
  size_t sVar13;
  ulong uVar14;
  code *pcVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined *puVar19;
  uint uVar20;
  char *fmt;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  float fVar28;
  ulong uVar29;
  double dVar30;
  ulong uVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint local_1f4;
  ulong local_1e0;
  uint8_t *local_1d8;
  uint8_t current_value;
  undefined7 uStack_1cf;
  unsigned_long local_1c8;
  unsigned_long local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  uint8_t line_buf [16];
  RedBoldTerminalGuard g;
  string field;
  ulong local_118;
  string line;
  uint8_t prev_line_buf [16];
  function<void_(const_void_*,_unsigned_long)> local_90;
  function<void_(const_void_*,_unsigned_long)> local_70;
  function<void_(const_void_*,_unsigned_long)> local_50;
  
  if (num_iovs != 0) {
    psVar10 = &iovs->iov_len;
    lVar21 = 0;
    sVar13 = num_iovs;
    while (bVar32 = sVar13 != 0, sVar13 = sVar13 - 1, bVar32) {
      lVar21 = lVar21 + *psVar10;
      psVar10 = psVar10 + 2;
    }
    if (lVar21 != 0) {
      if (num_prev_iovs != 0) {
        psVar10 = &prev_iovs->iov_len;
        lVar11 = 0;
        sVar13 = num_prev_iovs;
        while (bVar32 = sVar13 != 0, sVar13 = sVar13 - 1, bVar32) {
          lVar11 = lVar11 + *psVar10;
          psVar10 = psVar10 + 2;
        }
        if (lVar11 != lVar21) {
          this = (logic_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    ((runtime_error *)this,"previous iovs given, but data size does not match");
          puVar19 = &::std::runtime_error::typeinfo;
          pcVar15 = ::std::runtime_error::~runtime_error;
LAB_001096e1:
          __cxa_throw(this,puVar19,pcVar15);
        }
      }
      uVar22 = lVar21 + start_address;
      uVar20 = (uint)flags;
      if ((uVar20 >> 8 & 1) == 0) {
        if ((uVar20 >> 9 & 1) == 0) {
          local_1f4 = 8;
          if (((((uVar20 >> 10 & 1) == 0) && (local_1f4 = 0x10, (uVar20 >> 0xb & 1) == 0)) &&
              (local_1f4 = 0x10, uVar22 < 0x100000001)) && (local_1f4 = 8, uVar22 < 0x10001)) {
            local_1f4 = (uint)(0x100 < uVar22) * 2 + 2;
          }
        }
        else {
          local_1f4 = 4;
        }
      }
      else {
        local_1f4 = 2;
      }
      line_buf[0] = '\0';
      line_buf[1] = '\0';
      line_buf[2] = '\0';
      line_buf[3] = '\0';
      line_buf[4] = '\0';
      line_buf[5] = '\0';
      line_buf[6] = '\0';
      line_buf[7] = '\0';
      line_buf[8] = '\0';
      line_buf[9] = '\0';
      line_buf[10] = '\0';
      line_buf[0xb] = '\0';
      line_buf[0xc] = '\0';
      line_buf[0xd] = '\0';
      line_buf[0xe] = '\0';
      line_buf[0xf] = '\0';
      if (num_prev_iovs == 0) {
        local_1d8 = line_buf;
      }
      else {
        local_1d8 = prev_line_buf;
        prev_line_buf[0] = '\0';
        prev_line_buf[1] = '\0';
        prev_line_buf[2] = '\0';
        prev_line_buf[3] = '\0';
        prev_line_buf[4] = '\0';
        prev_line_buf[5] = '\0';
        prev_line_buf[6] = '\0';
        prev_line_buf[7] = '\0';
        prev_line_buf[8] = '\0';
        prev_line_buf[9] = '\0';
        prev_line_buf[10] = '\0';
        prev_line_buf[0xb] = '\0';
        prev_line_buf[0xc] = '\0';
        prev_line_buf[0xd] = '\0';
        prev_line_buf[0xe] = '\0';
        prev_line_buf[0xf] = '\0';
      }
      bVar32 = (flags & 0x40) == 0;
      uVar17 = (ulong)bVar32;
      fmt = "%0*lX";
      if (bVar32) {
        fmt = "%0*lX |";
      }
      local_1b0 = uVar17 + 1;
      lVar21 = (start_address & 0xfffffffffffffff0) - uVar22;
      uVar12 = (ulong)((uint)start_address & 0xf);
      uVar27 = 0;
      uVar16 = 0;
      uVar26 = 0;
      local_118 = 0;
      uVar25 = start_address & 0xfffffffffffffff0;
      uVar31 = uVar12;
      while( true ) {
        lVar21 = lVar21 + 0x10;
        uVar14 = 0;
        if (0 < (long)uVar31) {
          uVar14 = uVar31;
        }
        uVar18 = 0;
        if (0 < (long)uVar12) {
          uVar18 = uVar12;
        }
        lVar11 = 0;
        if (0 < lVar21) {
          lVar11 = lVar21;
        }
        if (uVar22 <= uVar25) break;
        uVar24 = (uint)uVar14 & 0xff;
        local_1a0 = (ulong)(uVar24 + 7 >> 3);
        local_1e0 = (ulong)(uVar24 + 3 >> 2);
        local_1a8 = uVar18 & 0xff;
        uVar14 = (ulong)(0x10U - ((int)lVar11 + (int)uVar18) & 0xff);
        uVar18 = start_address - uVar25;
        if ((long)uVar18 < 1) {
          uVar18 = 0;
        }
        uVar1 = uVar25 + 0x10;
        uVar29 = uVar1 - uVar22;
        if ((long)uVar29 < 1) {
          uVar29 = 0;
        }
        uVar18 = uVar18 & 0xff;
        for (uVar23 = 0; uVar23 != uVar14; uVar23 = uVar23 + 1) {
          psVar10 = &iovs[uVar27].iov_len;
          while (*psVar10 <= uVar16) {
            uVar27 = uVar27 + 1;
            psVar10 = psVar10 + 2;
            uVar16 = 0;
            if (num_iovs <= uVar27) {
              this = (logic_error *)__cxa_allocate_exception(0x10);
              ::std::logic_error::logic_error(this,"reads exceeded final iov");
              goto LAB_001096d3;
            }
          }
          line_buf[uVar18 + uVar23] =
               *(uint8_t *)((long)((iovec *)(psVar10 + -1))->iov_base + uVar16);
          uVar16 = uVar16 + 1;
        }
        if (num_prev_iovs != 0) {
          for (uVar23 = 0; uVar23 != uVar14; uVar23 = uVar23 + 1) {
            psVar10 = &prev_iovs[uVar26].iov_len;
            while (*psVar10 <= local_118) {
              uVar26 = uVar26 + 1;
              psVar10 = psVar10 + 2;
              local_118 = 0;
              if (num_prev_iovs <= uVar26) {
                this = (logic_error *)__cxa_allocate_exception(0x10);
                ::std::logic_error::logic_error(this,"reads exceeded final prev iov");
LAB_001096d3:
                puVar19 = &::std::logic_error::typeinfo;
                pcVar15 = ::std::logic_error::~logic_error;
                goto LAB_001096e1;
              }
            }
            prev_line_buf[uVar18 + uVar23] =
                 *(uint8_t *)((long)((iovec *)(psVar10 + -1))->iov_base + local_118);
            local_118 = local_118 + 1;
          }
        }
        if ((((flags & 0x20) == 0) || (uVar25 <= start_address)) || (uVar22 <= uVar1)) {
LAB_0010892a:
          string_printf_abi_cxx11_(&line,fmt,(ulong)local_1f4);
          ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                    (write_data,line._M_dataplus._M_p,line._M_string_length);
          uVar25 = local_1a8;
          while (bVar32 = uVar25 != 0, uVar25 = uVar25 - 1, bVar32) {
            ::std::function<void_(const_void_*,_unsigned_long)>::operator()(write_data,"   ",3);
          }
          uVar29 = uVar29 & 0xff;
          for (uVar25 = local_1a8; bVar9 = (byte)flags, uVar25 < 0x10 - uVar29; uVar25 = uVar25 + 1)
          {
            bVar3 = line_buf[uVar25];
            bVar4 = local_1d8[uVar25];
            ::std::function<void_(const_void_*,_unsigned_long)>::function(&local_90,write_data);
            RedBoldTerminalGuard::RedBoldTerminalGuard(&g,&local_90,(bool)(bVar4 != bVar3 & bVar9));
            ::std::_Function_base::~_Function_base(&local_90.super__Function_base);
            string_printf_abi_cxx11_(&field," %02X",(ulong)bVar3);
            ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                      (write_data,field._M_dataplus._M_p,field._M_string_length);
            ::std::__cxx11::string::~string((string *)&field);
            RedBoldTerminalGuard::~RedBoldTerminalGuard(&g);
          }
          for (; uVar25 < 0x10; uVar25 = uVar25 + 1) {
            ::std::function<void_(const_void_*,_unsigned_long)>::operator()(write_data,"   ",3);
          }
          if ((flags & 2) != 0) {
            ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                      (write_data," | ",uVar17 * 2 + 1);
            uVar25 = local_1a8;
            while (bVar32 = uVar25 != 0, uVar25 = uVar25 - 1, uVar14 = local_1a8, bVar32) {
              ::std::function<void_(const_void_*,_unsigned_long)>::operator()(write_data," ",1);
            }
            for (; uVar14 < 0x10 - uVar29; uVar14 = uVar14 + 1) {
              current_value = line_buf[uVar14];
              uVar5 = local_1d8[uVar14];
              ::std::function<void_(const_void_*,_unsigned_long)>::function(&local_50,write_data);
              RedBoldTerminalGuard::RedBoldTerminalGuard
                        (&g,&local_50,(bool)(uVar5 != current_value & bVar9));
              ::std::_Function_base::~_Function_base(&local_50.super__Function_base);
              if ((byte)(current_value + 0x81) < 0xa1) {
                ::std::function<void_(const_void_*,_unsigned_long)>::function(&local_70,write_data);
                InverseTerminalGuard::InverseTerminalGuard
                          ((InverseTerminalGuard *)&field,&local_70,(bool)(bVar9 & 1));
                ::std::_Function_base::~_Function_base(&local_70.super__Function_base);
                ::std::function<void_(const_void_*,_unsigned_long)>::operator()(write_data," ",1);
                InverseTerminalGuard::~InverseTerminalGuard((InverseTerminalGuard *)&field);
              }
              else {
                ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                          (write_data,&current_value,1);
              }
              RedBoldTerminalGuard::~RedBoldTerminalGuard(&g);
            }
            for (; uVar14 < 0x10; uVar14 = uVar14 + 1) {
              ::std::function<void_(const_void_*,_unsigned_long)>::operator()(write_data," ",1);
            }
          }
          iVar8 = (int)uVar18;
          if ((flags & 4) != 0) {
            if ((flags & 0x10) == 0) {
              if ((uVar20 >> 0xc & 1) == 0) {
                if ((uVar20 >> 0xd & 1) == 0) {
                  ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                            (write_data," |",local_1b0);
                  uVar25 = (ulong)(iVar8 + 3U >> 2);
                  while (bVar32 = local_1e0 != 0, local_1e0 = local_1e0 - 1, bVar32) {
                    ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                              (write_data,"             ",0xd);
                  }
                  for (; uVar25 < 4 - (uVar29 + 3 >> 2); uVar25 = uVar25 + 1) {
                    fVar28 = *(float *)(line_buf + uVar25 * 4);
                    fVar7 = *(float *)(local_1d8 + uVar25 * 4);
                    ::std::function<void_(const_void_*,_unsigned_long)>::function
                              ((function<void_(const_void_*,_unsigned_long)> *)&field,write_data);
                    RedBoldTerminalGuard::RedBoldTerminalGuard
                              (&g,(function<void_(const_void_*,_unsigned_long)> *)&field,
                               (bool)(fVar7 != fVar28 & bVar9));
                    ::std::_Function_base::~_Function_base((_Function_base *)&field);
                    string_printf_abi_cxx11_((string *)&current_value," %12.5g",(double)fVar28);
                    ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                              (write_data,(void *)CONCAT71(uStack_1cf,current_value),local_1c8);
                    ::std::__cxx11::string::~string((string *)&current_value);
                    RedBoldTerminalGuard::~RedBoldTerminalGuard(&g);
                  }
                  for (; uVar25 < 4; uVar25 = uVar25 + 1) {
                    ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                              (write_data,"             ",0xd);
                  }
                }
                else {
                  ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                            (write_data," |",local_1b0);
                  uVar25 = (ulong)(iVar8 + 3U >> 2);
                  while (bVar32 = local_1e0 != 0, local_1e0 = local_1e0 - 1, bVar32) {
                    ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                              (write_data,"             ",0xd);
                  }
                  for (; uVar25 < 4 - (uVar29 + 3 >> 2); uVar25 = uVar25 + 1) {
                    fVar28 = *(float *)(line_buf + uVar25 * 4);
                    fVar7 = *(float *)(local_1d8 + uVar25 * 4);
                    ::std::function<void_(const_void_*,_unsigned_long)>::function
                              ((function<void_(const_void_*,_unsigned_long)> *)&field,write_data);
                    RedBoldTerminalGuard::RedBoldTerminalGuard
                              (&g,(function<void_(const_void_*,_unsigned_long)> *)&field,
                               (bool)(fVar7 != fVar28 & bVar9));
                    ::std::_Function_base::~_Function_base((_Function_base *)&field);
                    string_printf_abi_cxx11_((string *)&current_value," %12.5g",(double)fVar28);
                    ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                              (write_data,(void *)CONCAT71(uStack_1cf,current_value),local_1c8);
                    ::std::__cxx11::string::~string((string *)&current_value);
                    RedBoldTerminalGuard::~RedBoldTerminalGuard(&g);
                  }
                  for (; uVar25 < 4; uVar25 = uVar25 + 1) {
                    ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                              (write_data,"             ",0xd);
                  }
                }
              }
              else {
                ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                          (write_data," |",local_1b0);
                uVar25 = (ulong)(iVar8 + 3U >> 2);
                while (bVar32 = local_1e0 != 0, local_1e0 = local_1e0 - 1, bVar32) {
                  ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                            (write_data,"             ",0xd);
                }
                local_1a8 = 4 - (uVar29 + 3 >> 2);
                for (; uVar25 < local_1a8; uVar25 = uVar25 + 1) {
                  uVar24 = *(uint *)(line_buf + uVar25 * 4);
                  uVar6 = *(uint *)(local_1d8 + uVar25 * 4);
                  ::std::function<void_(const_void_*,_unsigned_long)>::function
                            ((function<void_(const_void_*,_unsigned_long)> *)&field,write_data);
                  fVar28 = (float)(uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 |
                                   (uVar24 & 0xff00) << 8 | uVar24 << 0x18);
                  RedBoldTerminalGuard::RedBoldTerminalGuard
                            (&g,(function<void_(const_void_*,_unsigned_long)> *)&field,
                             (bool)((float)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 |
                                            (uVar6 & 0xff00) << 8 | uVar6 << 0x18) != fVar28 & bVar9
                                   ));
                  ::std::_Function_base::~_Function_base((_Function_base *)&field);
                  string_printf_abi_cxx11_((string *)&current_value," %12.5g",(double)fVar28);
                  ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                            (write_data,(void *)CONCAT71(uStack_1cf,current_value),local_1c8);
                  ::std::__cxx11::string::~string((string *)&current_value);
                  RedBoldTerminalGuard::~RedBoldTerminalGuard(&g);
                }
                for (; uVar25 < 4; uVar25 = uVar25 + 1) {
                  ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                            (write_data,"             ",0xd);
                }
              }
            }
            else {
              ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                        (write_data," |",local_1b0);
              uVar25 = (ulong)(iVar8 + 3U >> 2);
              while (bVar32 = local_1e0 != 0, local_1e0 = local_1e0 - 1, bVar32) {
                ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                          (write_data,"             ",0xd);
              }
              local_1a8 = 4 - (uVar29 + 3 >> 2);
              for (; uVar25 < local_1a8; uVar25 = uVar25 + 1) {
                uVar24 = *(uint *)(line_buf + uVar25 * 4);
                uVar6 = *(uint *)(local_1d8 + uVar25 * 4);
                ::std::function<void_(const_void_*,_unsigned_long)>::function
                          ((function<void_(const_void_*,_unsigned_long)> *)&field,write_data);
                fVar28 = (float)(uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8
                                | uVar24 << 0x18);
                RedBoldTerminalGuard::RedBoldTerminalGuard
                          (&g,(function<void_(const_void_*,_unsigned_long)> *)&field,
                           (bool)((float)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 |
                                          (uVar6 & 0xff00) << 8 | uVar6 << 0x18) != fVar28 & bVar9))
                ;
                ::std::_Function_base::~_Function_base((_Function_base *)&field);
                string_printf_abi_cxx11_((string *)&current_value," %12.5g",(double)fVar28);
                ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                          (write_data,(void *)CONCAT71(uStack_1cf,current_value),local_1c8);
                ::std::__cxx11::string::~string((string *)&current_value);
                RedBoldTerminalGuard::~RedBoldTerminalGuard(&g);
              }
              for (; uVar25 < 4; uVar25 = uVar25 + 1) {
                ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                          (write_data,"             ",0xd);
              }
            }
          }
          if ((flags & 8) != 0) {
            if ((flags & 0x10) == 0) {
              if ((uVar20 >> 0xc & 1) == 0) {
                if ((uVar20 >> 0xd & 1) == 0) {
                  ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                            (write_data," |",local_1b0);
                  uVar25 = (ulong)(iVar8 + 7U >> 3);
                  while (bVar32 = local_1a0 != 0, local_1a0 = local_1a0 - 1, bVar32) {
                    ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                              (write_data,"             ",0xd);
                  }
                  for (; uVar25 < 2 - (uVar29 + 7 >> 3); uVar25 = uVar25 + 1) {
                    dVar30 = *(double *)(line_buf + uVar25 * 8);
                    dVar2 = *(double *)(local_1d8 + uVar25 * 8);
                    ::std::function<void_(const_void_*,_unsigned_long)>::function
                              ((function<void_(const_void_*,_unsigned_long)> *)&field,write_data);
                    RedBoldTerminalGuard::RedBoldTerminalGuard
                              (&g,(function<void_(const_void_*,_unsigned_long)> *)&field,
                               (bool)(dVar2 != dVar30 & bVar9));
                    ::std::_Function_base::~_Function_base((_Function_base *)&field);
                    string_printf_abi_cxx11_((string *)&current_value," %12.5lg",dVar30);
                    ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                              (write_data,(void *)CONCAT71(uStack_1cf,current_value),local_1c8);
                    ::std::__cxx11::string::~string((string *)&current_value);
                    RedBoldTerminalGuard::~RedBoldTerminalGuard(&g);
                  }
                  for (; uVar25 < 2; uVar25 = uVar25 + 1) {
                    ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                              (write_data,"             ",0xd);
                  }
                }
                else {
                  ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                            (write_data," |",local_1b0);
                  uVar25 = (ulong)(iVar8 + 7U >> 3);
                  while (bVar32 = local_1a0 != 0, local_1a0 = local_1a0 - 1, bVar32) {
                    ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                              (write_data,"             ",0xd);
                  }
                  for (; uVar25 < 2 - (uVar29 + 7 >> 3); uVar25 = uVar25 + 1) {
                    dVar30 = *(double *)(line_buf + uVar25 * 8);
                    dVar2 = *(double *)(local_1d8 + uVar25 * 8);
                    ::std::function<void_(const_void_*,_unsigned_long)>::function
                              ((function<void_(const_void_*,_unsigned_long)> *)&field,write_data);
                    RedBoldTerminalGuard::RedBoldTerminalGuard
                              (&g,(function<void_(const_void_*,_unsigned_long)> *)&field,
                               (bool)(dVar2 != dVar30 & bVar9));
                    ::std::_Function_base::~_Function_base((_Function_base *)&field);
                    string_printf_abi_cxx11_((string *)&current_value," %12.5lg",dVar30);
                    ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                              (write_data,(void *)CONCAT71(uStack_1cf,current_value),local_1c8);
                    ::std::__cxx11::string::~string((string *)&current_value);
                    RedBoldTerminalGuard::~RedBoldTerminalGuard(&g);
                  }
                  for (; uVar25 < 2; uVar25 = uVar25 + 1) {
                    ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                              (write_data,"             ",0xd);
                  }
                }
              }
              else {
                ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                          (write_data," |",local_1b0);
                uVar25 = (ulong)(iVar8 + 7U >> 3);
                while (bVar32 = local_1a0 != 0, local_1a0 = local_1a0 - 1, bVar32) {
                  ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                            (write_data,"             ",0xd);
                }
                local_1a0 = 2 - (uVar29 + 7 >> 3);
                for (; uVar25 < local_1a0; uVar25 = uVar25 + 1) {
                  uVar14 = *(ulong *)(line_buf + uVar25 * 8);
                  uVar18 = *(ulong *)(local_1d8 + uVar25 * 8);
                  ::std::function<void_(const_void_*,_unsigned_long)>::function
                            ((function<void_(const_void_*,_unsigned_long)> *)&field,write_data);
                  dVar30 = (double)(uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                                    (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8
                                    | (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 |
                                    (uVar14 & 0xff00) << 0x28 | uVar14 << 0x38);
                  RedBoldTerminalGuard::RedBoldTerminalGuard
                            (&g,(function<void_(const_void_*,_unsigned_long)> *)&field,
                             (bool)((double)(uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                                             (uVar18 & 0xff0000000000) >> 0x18 |
                                             (uVar18 & 0xff00000000) >> 8 |
                                             (uVar18 & 0xff000000) << 8 |
                                             (uVar18 & 0xff0000) << 0x18 | (uVar18 & 0xff00) << 0x28
                                            | uVar18 << 0x38) != dVar30 & bVar9));
                  ::std::_Function_base::~_Function_base((_Function_base *)&field);
                  string_printf_abi_cxx11_((string *)&current_value," %12.5lg",dVar30);
                  ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                            (write_data,(void *)CONCAT71(uStack_1cf,current_value),local_1c8);
                  ::std::__cxx11::string::~string((string *)&current_value);
                  RedBoldTerminalGuard::~RedBoldTerminalGuard(&g);
                }
                for (; uVar25 < 2; uVar25 = uVar25 + 1) {
                  ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                            (write_data,"             ",0xd);
                }
              }
            }
            else {
              ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                        (write_data," |",local_1b0);
              uVar25 = (ulong)(iVar8 + 7U >> 3);
              while (bVar32 = local_1a0 != 0, local_1a0 = local_1a0 - 1, bVar32) {
                ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                          (write_data,"             ",0xd);
              }
              local_1a0 = 2 - (uVar29 + 7 >> 3);
              for (; uVar25 < local_1a0; uVar25 = uVar25 + 1) {
                uVar14 = *(ulong *)(line_buf + uVar25 * 8);
                uVar18 = *(ulong *)(local_1d8 + uVar25 * 8);
                ::std::function<void_(const_void_*,_unsigned_long)>::function
                          ((function<void_(const_void_*,_unsigned_long)> *)&field,write_data);
                dVar30 = (double)(uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                                  (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
                                  (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 |
                                  (uVar14 & 0xff00) << 0x28 | uVar14 << 0x38);
                RedBoldTerminalGuard::RedBoldTerminalGuard
                          (&g,(function<void_(const_void_*,_unsigned_long)> *)&field,
                           (bool)((double)(uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                                           (uVar18 & 0xff0000000000) >> 0x18 |
                                           (uVar18 & 0xff00000000) >> 8 | (uVar18 & 0xff000000) << 8
                                           | (uVar18 & 0xff0000) << 0x18 | (uVar18 & 0xff00) << 0x28
                                          | uVar18 << 0x38) != dVar30 & bVar9));
                ::std::_Function_base::~_Function_base((_Function_base *)&field);
                string_printf_abi_cxx11_((string *)&current_value," %12.5lg",dVar30);
                ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                          (write_data,(void *)CONCAT71(uStack_1cf,current_value),local_1c8);
                ::std::__cxx11::string::~string((string *)&current_value);
                RedBoldTerminalGuard::~RedBoldTerminalGuard(&g);
              }
              for (; uVar25 < 2; uVar25 = uVar25 + 1) {
                ::std::function<void_(const_void_*,_unsigned_long)>::operator()
                          (write_data,"             ",0xd);
              }
            }
          }
          ::std::function<void_(const_void_*,_unsigned_long)>::operator()(write_data,"\n",1);
          ::std::__cxx11::string::~string((string *)&line);
        }
        else {
          auVar33[0] = -(line_buf[0] == '\0');
          auVar33[1] = -(line_buf[1] == '\0');
          auVar33[2] = -(line_buf[2] == '\0');
          auVar33[3] = -(line_buf[3] == '\0');
          auVar33[4] = -(line_buf[4] == '\0');
          auVar33[5] = -(line_buf[5] == '\0');
          auVar33[6] = -(line_buf[6] == '\0');
          auVar33[7] = -(line_buf[7] == '\0');
          auVar33[8] = -(line_buf[8] == '\0');
          auVar33[9] = -(line_buf[9] == '\0');
          auVar33[10] = -(line_buf[10] == '\0');
          auVar33[0xb] = -(line_buf[0xb] == '\0');
          auVar33[0xc] = -(line_buf[0xc] == '\0');
          auVar33[0xd] = -(line_buf[0xd] == '\0');
          auVar33[0xe] = -(line_buf[0xe] == '\0');
          auVar33[0xf] = -(line_buf[0xf] == '\0');
          if (((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar33[0xf] >> 7) << 0xf) != 0xffff) ||
             (auVar34[0] = -(*local_1d8 == '\0'), auVar34[1] = -(local_1d8[1] == '\0'),
             auVar34[2] = -(local_1d8[2] == '\0'), auVar34[3] = -(local_1d8[3] == '\0'),
             auVar34[4] = -(local_1d8[4] == '\0'), auVar34[5] = -(local_1d8[5] == '\0'),
             auVar34[6] = -(local_1d8[6] == '\0'), auVar34[7] = -(local_1d8[7] == '\0'),
             auVar34[8] = -(local_1d8[8] == '\0'), auVar34[9] = -(local_1d8[9] == '\0'),
             auVar34[10] = -(local_1d8[10] == '\0'), auVar34[0xb] = -(local_1d8[0xb] == '\0'),
             auVar34[0xc] = -(local_1d8[0xc] == '\0'), auVar34[0xd] = -(local_1d8[0xd] == '\0'),
             auVar34[0xe] = -(local_1d8[0xe] == '\0'), auVar34[0xf] = -(local_1d8[0xf] == '\0'),
             (ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar34[0xf] >> 7) << 0xf) != 0xffff)) goto LAB_0010892a;
        }
        uVar12 = uVar12 - 0x10;
        uVar31 = uVar31 - 0x10;
        uVar25 = uVar1;
      }
    }
  }
  return;
}

Assistant:

void format_data(
    function<void(const void*, size_t)> write_data,
    const struct iovec* iovs,
    size_t num_iovs,
    uint64_t start_address,
    const struct iovec* prev_iovs,
    size_t num_prev_iovs,
    uint64_t flags) {
  if (num_iovs == 0) {
    return;
  }

  size_t total_size = 0;
  for (size_t x = 0; x < num_iovs; x++) {
    total_size += iovs[x].iov_len;
  }
  if (total_size == 0) {
    return;
  }

  if (num_prev_iovs) {
    size_t total_prev_size = 0;
    for (size_t x = 0; x < num_prev_iovs; x++) {
      total_prev_size += prev_iovs[x].iov_len;
    }
    if (total_prev_size != total_size) {
      throw runtime_error("previous iovs given, but data size does not match");
    }
  }

  uint64_t end_address = start_address + total_size;

  int width_digits;
  if (flags & PrintDataFlags::OFFSET_8_BITS) {
    width_digits = 2;
  } else if (flags & PrintDataFlags::OFFSET_16_BITS) {
    width_digits = 4;
  } else if (flags & PrintDataFlags::OFFSET_32_BITS) {
    width_digits = 8;
  } else if (flags & PrintDataFlags::OFFSET_64_BITS) {
    width_digits = 16;
  } else if (end_address > 0x100000000) {
    width_digits = 16;
  } else if (end_address > 0x10000) {
    width_digits = 8;
  } else if (end_address > 0x100) {
    width_digits = 4;
  } else {
    width_digits = 2;
  }

  bool use_color = flags & PrintDataFlags::USE_COLOR;
  bool print_ascii = flags & PrintDataFlags::PRINT_ASCII;
  bool print_float = flags & PrintDataFlags::PRINT_FLOAT;
  bool print_double = flags & PrintDataFlags::PRINT_DOUBLE;
  bool reverse_endian = flags & PrintDataFlags::REVERSE_ENDIAN_FLOATS;
  bool big_endian = flags & PrintDataFlags::BIG_ENDIAN_FLOATS;
  bool little_endian = flags & PrintDataFlags::LITTLE_ENDIAN_FLOATS;
  bool collapse_zero_lines = flags & PrintDataFlags::COLLAPSE_ZERO_LINES;
  bool skip_separator = flags & PrintDataFlags::SKIP_SEPARATOR;

  // Reserve space for the current/previous line data
  uint8_t line_buf[0x10];
  memset(line_buf, 0, sizeof(line_buf));

  uint8_t prev_line_buf[0x10];
  uint8_t* prev_line_data = prev_line_buf;
  if (num_prev_iovs) {
    memset(prev_line_buf, 0, sizeof(prev_line_buf));
  } else {
    prev_line_data = line_buf;
  }

  size_t current_iov_index = 0;
  size_t current_iov_bytes = 0;
  size_t prev_iov_index = 0;
  size_t prev_iov_bytes = 0;
  for (uint64_t line_start_address = start_address & (~0x0F);
       line_start_address < end_address;
       line_start_address += 0x10) {

    // Figure out the boundaries of the current line
    uint64_t line_end_address = line_start_address + 0x10;
    uint8_t line_invalid_start_bytes = max<int64_t>(start_address - line_start_address, 0);
    uint8_t line_invalid_end_bytes = max<int64_t>(line_end_address - end_address, 0);
    uint8_t line_bytes = 0x10 - line_invalid_end_bytes - line_invalid_start_bytes;

    auto print_fields_column = [&]<typename LoadedDataT, typename StoredDataT>(
                                   const char* field_format,
                                   const void* blank_format,
                                   size_t blank_format_len) -> void {
      write_data(" |", skip_separator ? 1 : 2);

      const auto* line_fields = reinterpret_cast<const StoredDataT*>(line_buf);
      const auto* prev_line_fields = reinterpret_cast<const StoredDataT*>(prev_line_data);
      uint8_t line_invalid_start_fields = (line_invalid_start_bytes + sizeof(StoredDataT) - 1) / sizeof(StoredDataT);
      uint8_t line_invalid_end_fields = (line_invalid_end_bytes + sizeof(StoredDataT) - 1) / sizeof(StoredDataT);

      constexpr size_t field_count = 0x10 / sizeof(StoredDataT);
      size_t x = 0;
      for (; x < line_invalid_start_fields; x++) {
        write_data(blank_format, blank_format_len);
      }
      for (; x < static_cast<size_t>(field_count - line_invalid_end_fields); x++) {
        LoadedDataT current_value = line_fields[x];
        LoadedDataT previous_value = prev_line_fields[x];

        RedBoldTerminalGuard g1(write_data, use_color && (previous_value != current_value));
        string field = string_printf(field_format, current_value);
        write_data(field.data(), field.size());
      }
      for (; x < field_count; x++) {
        write_data(blank_format, blank_format_len);
      }
    };

    // Read the current and previous data for this line
    for (size_t x = 0; x < line_bytes; x++) {
      while (current_iov_bytes >= iovs[current_iov_index].iov_len) {
        current_iov_bytes = 0;
        current_iov_index++;
        if (current_iov_index >= num_iovs) {
          throw logic_error("reads exceeded final iov");
        }
      }
      line_buf[x + line_invalid_start_bytes] = reinterpret_cast<const uint8_t*>(
          iovs[current_iov_index].iov_base)[current_iov_bytes];
      current_iov_bytes++;
    }
    if (num_prev_iovs) {
      for (size_t x = 0; x < line_bytes; x++) {
        while (prev_iov_bytes >= prev_iovs[prev_iov_index].iov_len) {
          prev_iov_bytes = 0;
          prev_iov_index++;
          if (prev_iov_index >= num_prev_iovs) {
            throw logic_error("reads exceeded final prev iov");
          }
        }
        prev_line_buf[x + line_invalid_start_bytes] = reinterpret_cast<const uint8_t*>(
            prev_iovs[prev_iov_index].iov_base)[prev_iov_bytes];
        prev_iov_bytes++;
      }
    }

    if (collapse_zero_lines && (line_start_address > start_address) && (line_end_address < end_address) &&
        !memcmp(line_buf, "\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0", 16) &&
        !memcmp(prev_line_data, "\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0", 16)) {
      continue;
    }

    string line = string_printf(skip_separator ? "%0*" PRIX64 : "%0*" PRIX64 " |",
        width_digits, line_start_address);
    write_data(line.data(), line.size());

    {
      size_t x = 0;
      for (; x < line_invalid_start_bytes; x++) {
        write_data("   ", 3);
      }
      for (; x < static_cast<size_t>(0x10 - line_invalid_end_bytes); x++) {
        uint8_t current_value = line_buf[x];
        uint8_t previous_value = prev_line_data[x];

        RedBoldTerminalGuard g(write_data, use_color && (previous_value != current_value));
        string field = string_printf(" %02" PRIX8, current_value);
        write_data(field.data(), field.size());
      }
      for (; x < 0x10; x++) {
        write_data("   ", 3);
      }
    }

    if (print_ascii) {
      write_data(" | ", skip_separator ? 1 : 3);

      size_t x = 0;
      for (; x < line_invalid_start_bytes; x++) {
        write_data(" ", 1);
      }
      for (; x < static_cast<size_t>(0x10 - line_invalid_end_bytes); x++) {
        uint8_t current_value = line_buf[x];
        uint8_t previous_value = prev_line_data[x];

        RedBoldTerminalGuard g1(write_data, use_color && (previous_value != current_value));
        if ((current_value < 0x20) || (current_value >= 0x7F)) {
          InverseTerminalGuard g2(write_data, use_color);
          write_data(" ", 1);
        } else {
          write_data(&current_value, 1);
        }
      }
      for (; x < 0x10; x++) {
        write_data(" ", 1);
      }
    }

    if (print_float) {
      if (reverse_endian) {
        print_fields_column.operator()<float, re_float>(" %12.5g", "             ", 13);
      } else if (big_endian) {
        print_fields_column.operator()<float, be_float>(" %12.5g", "             ", 13);
      } else if (little_endian) {
        print_fields_column.operator()<float, le_float>(" %12.5g", "             ", 13);
      } else {
        print_fields_column.operator()<float, float>(" %12.5g", "             ", 13);
      }
    }
    if (print_double) {
      if (reverse_endian) {
        print_fields_column.operator()<double, re_double>(" %12.5lg", "             ", 13);
      } else if (big_endian) {
        print_fields_column.operator()<double, be_double>(" %12.5lg", "             ", 13);
      } else if (little_endian) {
        print_fields_column.operator()<double, le_double>(" %12.5lg", "             ", 13);
      } else {
        print_fields_column.operator()<double, double>(" %12.5lg", "             ", 13);
      }
    }

    write_data("\n", 1);
  }
}